

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O1

int nva_rsunitsz(nva_regspace *regspace)

{
  uint uVar1;
  
  if (regspace->type - NVA_REGSPACE_RDI < 2) {
    uVar1 = (regspace->card->chipset).chipset;
    if ((0x1f < uVar1) || ((0x81800000U >> (uVar1 & 0x1f) & 1) == 0)) {
      return 1;
    }
  }
  else if (regspace->type != NVA_REGSPACE_DPRAM) {
    return 1;
  }
  return 4;
}

Assistant:

int nva_rsunitsz(struct nva_regspace *regspace) {
	switch (regspace->type) {
		case NVA_REGSPACE_DPRAM:
			return 4;
		case NVA_REGSPACE_RDI:
		case NVA_REGSPACE_RDIB:
			if (regspace->card->chipset.chipset == 0x17 || regspace->card->chipset.chipset == 0x18 || regspace->card->chipset.chipset == 0x1f) {
				return 4;
			}
			return 1;
		default:
			return 1;
	}
}